

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::Internal::
     Evaluator<bsim::quad_value_bit_vector,_bsim::quad_value_bit_vector,_(Catch::Internal::Operator)0>
     ::evaluate(quad_value_bit_vector *lhs,quad_value_bit_vector *rhs)

{
  bool bVar1;
  quad_value_bit_vector *b;
  quad_value_bit_vector *in_RSI;
  quad_value_bit_vector *in_RDI;
  
  b = opCast<bsim::quad_value_bit_vector>(in_RDI);
  opCast<bsim::quad_value_bit_vector>(in_RSI);
  bVar1 = bsim::operator==(in_RSI,b);
  return bVar1;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }